

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::sectionStarting(XmlReporter *this,SectionInfo *sectionInfo)

{
  int iVar1;
  XmlWriter *pXVar2;
  string *in_RDI;
  SectionInfo *in_stack_ffffffffffffff48;
  StreamingReporterBase<Catch::XmlReporter> *in_stack_ffffffffffffff50;
  XmlFormatting fmt;
  string *name;
  string local_90 [16];
  allocator<char> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  string local_68 [8];
  string *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  XmlWriter *in_stack_ffffffffffffffb0;
  SourceLineInfo *in_stack_ffffffffffffffc8;
  XmlReporter *in_stack_ffffffffffffffd0;
  
  StreamingReporterBase<Catch::XmlReporter>::sectionStarting
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  fmt = (XmlFormatting)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  iVar1 = *(int *)((long)&in_RDI[0xd].field_2 + 8);
  *(int *)((long)&in_RDI[0xd].field_2 + 8) = iVar1 + 1;
  if (0 < iVar1) {
    name = (string *)&in_RDI[0xb].field_2;
    pXVar2 = (XmlWriter *)&stack0xffffffffffffffcf;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    operator|(Newline,Indent);
    pXVar2 = XmlWriter::startElement(pXVar2,name,fmt);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    trim(in_RDI);
    XmlWriter::writeAttribute
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffcf);
    writeSourceInfo(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    XmlWriter::ensureTagClosed(pXVar2);
  }
  return;
}

Assistant:

void XmlReporter::sectionStarting( SectionInfo const& sectionInfo ) {
        StreamingReporterBase::sectionStarting( sectionInfo );
        if( m_sectionDepth++ > 0 ) {
            m_xml.startElement( "Section" )
                .writeAttribute( "name", trim( sectionInfo.name ) );
            writeSourceInfo( sectionInfo.lineInfo );
            m_xml.ensureTagClosed();
        }
    }